

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32(CodedInputStream *this,uint32 *value)

{
  uint32 *value_local;
  CodedInputStream *this_local;
  
  if ((this->buffer_ < this->buffer_end_) && (*this->buffer_ < 0x80)) {
    *value = (uint)*this->buffer_;
    Advance(this,1);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = ReadVarint32Fallback(this,value);
  }
  return this_local._7_1_;
}

Assistant:

inline bool CodedInputStream::ReadVarint32(uint32* value) {
  if (GOOGLE_PREDICT_TRUE(buffer_ < buffer_end_) && *buffer_ < 0x80) {
    *value = *buffer_;
    Advance(1);
    return true;
  } else {
    return ReadVarint32Fallback(value);
  }
}